

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVHandlePtr.h
# Opt level: O0

void __thiscall
cm::uv_handle_ptr_base_<uv_stream_s>::uv_handle_ptr_base_<cm::uv_tty_ptr,void>
          (uv_handle_ptr_base_<uv_stream_s> *this,uv_tty_ptr *rhs)

{
  __shared_ptr<uv_tty_s,_(__gnu_cxx::_Lock_policy)2> *__r;
  uv_stream_t *__p;
  shared_ptr<uv_stream_s> local_28;
  __shared_ptr<uv_tty_s,_(__gnu_cxx::_Lock_policy)2> *local_18;
  uv_tty_ptr *rhs_local;
  uv_handle_ptr_base_<uv_stream_s> *this_local;
  
  local_18 = (__shared_ptr<uv_tty_s,_(__gnu_cxx::_Lock_policy)2> *)rhs;
  rhs_local = (uv_tty_ptr *)this;
  std::shared_ptr<uv_stream_s>::shared_ptr(&this->handle);
  __r = local_18;
  __p = uv_tty_ptr::operator_cast_to_uv_stream_s_((uv_tty_ptr *)local_18);
  std::shared_ptr<uv_stream_s>::shared_ptr<uv_tty_s>(&local_28,(shared_ptr<uv_tty_s> *)__r,__p);
  std::shared_ptr<uv_stream_s>::operator=(&this->handle,&local_28);
  std::shared_ptr<uv_stream_s>::~shared_ptr(&local_28);
  std::__shared_ptr<uv_tty_s,_(__gnu_cxx::_Lock_policy)2>::reset(local_18);
  return;
}

Assistant:

uv_handle_ptr_base_(S&& rhs)
  {
    // This will force a compiler error if rhs doesn't have a casting
    // operator to get T*
    this->handle = std::shared_ptr<T>(rhs.handle, rhs);
    rhs.handle.reset();
  }